

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionRewriting.cpp
# Opt level: O1

bool __thiscall
Inferences::FunctionDefinitionDemodulation::perform
          (FunctionDefinitionDemodulation *this,Clause *cl,Clause **replacement,
          ClauseIterator *premises)

{
  long *plVar1;
  int *piVar2;
  Literal *eqLit;
  bool bVar3;
  int iVar4;
  uint uVar5;
  void **head;
  TermList rwTerm;
  TermList TVar6;
  Clause *pCVar7;
  ulong uVar8;
  TypedTermList t;
  bool isEqTautology;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
  git;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause> qr;
  ResultSubstitutionSP local_118;
  FunctionDefinitionDemodulation *local_108;
  DemodulationHelper *local_100;
  Clause *local_f8;
  Term *local_f0;
  ulong local_e8;
  _func_int **local_e0;
  ulong local_d8;
  Clause **local_d0;
  ClauseIterator *local_c8;
  DemodulationHelper *local_c0;
  Ordering *local_b8;
  NonVariableNonTypeIterator it;
  SimplifyingInference2 local_78;
  long *local_60 [6];
  
  local_b8 = (((this->super_ForwardSimplificationEngine).super_InferenceEngine._salg)->_ordering).
             _obj;
  local_108 = this;
  local_d0 = replacement;
  local_c8 = premises;
  if (perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::attempted ==
      '\0') {
    perform();
  }
  ::Lib::DHMap<Kernel::Term_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (&perform::attempted._map);
  if ((*(ulong *)&cl->field_0x38 & 0xfffff) == 0) {
    bVar3 = false;
  }
  else {
    local_100 = &local_108->_helper;
    local_e8 = (ulong)((uint)*(ulong *)&cl->field_0x38 & 0xfffff);
    local_d8 = 0;
    local_e0 = (_func_int **)&PTR__NonVariableNonTypeIterator_00b69b28;
    pCVar7 = cl;
    local_f8 = cl;
    do {
      local_f0 = &pCVar7->_literals[local_d8]->super_Term;
      Kernel::NonVariableNonTypeIterator::NonVariableNonTypeIterator(&it,local_f0,false);
      iVar4 = 0;
      if (it._stack._cursor != it._stack._stack) {
        do {
          rwTerm._content = (uint64_t)Kernel::NonVariableNonTypeIterator::next(&it);
          Kernel::SortHelper::getResultSort((Term *)rwTerm._content);
          bVar3 = ::Lib::
                  DHMap<Kernel::Term_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
                  insert(&perform::attempted._map,rwTerm._content);
          if (bVar3) {
            bVar3 = DemodulationHelper::redundancyCheckNeededForPremise
                              (local_100,pCVar7,(Literal *)local_f0,rwTerm);
            t._sort._content = rwTerm._content;
            t.super_TermList._content =
                 (uint64_t)
                 ((local_108->super_ForwardSimplificationEngine).super_InferenceEngine._salg)->
                 _fnDefHandler;
            Shell::FunctionDefinitionHandler::getGeneralizations
                      ((FunctionDefinitionHandler *)&git,t);
            local_c0 = (DemodulationHelper *)0x0;
            if (bVar3) {
              local_c0 = local_100;
            }
            do {
              iVar4 = (*(git._core)->_vptr_IteratorCore[2])();
              if ((char)iVar4 == '\0') {
                iVar4 = 0;
                break;
              }
              (*(git._core)->_vptr_IteratorCore[3])(&qr);
              iVar4 = 7;
              if ((*(uint *)&(qr.data)->clause->field_0x38 & 0xfffff) == 1) {
                TVar6 = Kernel::EqHelper::getOtherEqualitySide
                                  ((qr.data)->literal,((qr.data)->term).super_TermList._content);
                uVar5 = (*local_b8->_vptr_Ordering[3])
                                  (local_b8,TVar6._content,((qr.data)->term).super_TermList._content
                                  );
                if ((uVar5 & 0xfffffffd) != 1) {
                  isEqTautology = false;
                  pCVar7 = (qr.data)->clause;
                  TVar6._content = ((qr.data)->term).super_TermList._content;
                  eqLit = (qr.data)->literal;
                  local_118._obj = qr.unifier._obj;
                  local_118._refCnt = qr.unifier._refCnt;
                  if (qr.unifier._refCnt != (RefCounter *)0x0 &&
                      qr.unifier._obj != (ResultSubstitution *)0x0) {
                    (qr.unifier._refCnt)->_val = (qr.unifier._refCnt)->_val + 1;
                  }
                  local_78.premise2 = (qr.data)->clause;
                  local_78.rule = FUNCTION_DEFINITION_DEMODULATION;
                  local_78.premise1 = cl;
                  Kernel::Inference::Inference((Inference *)local_60,&local_78);
                  pCVar7 = performRewriting(cl,(Literal *)local_f0,rwTerm,pCVar7,eqLit,TVar6,
                                            &local_118,local_c0,&isEqTautology,(Inference *)local_60
                                           );
                  if (((((Entry *)local_118._obj != (Entry *)0x0) &&
                       ((Entry *)local_118._refCnt != (Entry *)0x0)) &&
                      (((anon_union_4_2_6ecd024b_for_Entry_0 *)&(local_118._refCnt)->_val)->
                       _infoData = ((anon_union_4_2_6ecd024b_for_Entry_0 *)
                                   &(local_118._refCnt)->_val)->_infoData + -1,
                      ((anon_union_4_2_6ecd024b_for_Entry_0 *)&(local_118._refCnt)->_val)->_infoData
                      == 0)) &&
                     ((*(local_118._obj)->_vptr_ResultSubstitution[1])(),
                     (Entry *)local_118._refCnt != (Entry *)0x0)) {
                    *(undefined8 *)local_118._refCnt = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_118._refCnt;
                  }
                  if ((pCVar7 != (Clause *)0x0) || (iVar4 = 7, isEqTautology != false)) {
                    if (isEqTautology == false) {
                      *local_d0 = pCVar7;
                    }
                    pCVar7 = (qr.data)->clause;
                    local_60[0] = (long *)::Lib::FixedSizeAllocator<32UL>::alloc
                                                    ((FixedSizeAllocator<32UL> *)
                                                     (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
                    *(undefined4 *)(local_60[0] + 1) = 0;
                    *local_60[0] = (long)&PTR__IteratorCore_00b63388;
                    *(undefined1 *)(local_60[0] + 2) = 0;
                    local_60[0][3] = (long)pCVar7;
                    *(undefined4 *)(local_60[0] + 1) = 1;
                    ::Lib::VirtualIterator<Kernel::Clause_*>::operator=
                              (local_c8,(VirtualIterator<Kernel::Clause_*> *)local_60);
                    if (local_60[0] != (long *)0x0) {
                      plVar1 = local_60[0] + 1;
                      *(int *)plVar1 = (int)*plVar1 + -1;
                      if ((int)*plVar1 == 0) {
                        (**(code **)(*local_60[0] + 8))();
                      }
                    }
                    iVar4 = 1;
                  }
                }
              }
              if (((qr.unifier._obj != (ResultSubstitution *)0x0) &&
                  (qr.unifier._refCnt != (RefCounter *)0x0)) &&
                 (((qr.unifier._refCnt)->_val = (qr.unifier._refCnt)->_val + -1,
                  (qr.unifier._refCnt)->_val == 0 &&
                  ((*(qr.unifier._obj)->_vptr_ResultSubstitution[1])(),
                  qr.unifier._refCnt != (RefCounter *)0x0)))) {
                *(undefined8 *)qr.unifier._refCnt = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = qr.unifier._refCnt;
              }
            } while (iVar4 == 7);
            pCVar7 = local_f8;
            if (git._core !=
                (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
                 *)0x0) {
              piVar2 = &(git._core)->_refCnt;
              *piVar2 = *piVar2 + -1;
              if (*piVar2 == 0) {
                (*(git._core)->_vptr_IteratorCore[1])();
                pCVar7 = local_f8;
              }
            }
          }
          else {
            iVar4 = 5;
            Kernel::NonVariableNonTypeIterator::right(&it);
          }
          if ((iVar4 != 5) && (iVar4 != 0)) goto LAB_004deb4f;
        } while (it._stack._cursor != it._stack._stack);
        iVar4 = 0;
      }
LAB_004deb4f:
      it.super_IteratorCore<Kernel::Term_*>._vptr_IteratorCore = local_e0;
      if (it._stack._stack != (Term **)0x0) {
        uVar8 = it._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
        if (uVar8 == 0) {
          *it._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = it._stack._stack;
        }
        else if (uVar8 < 0x11) {
          *it._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = it._stack._stack;
        }
        else if (uVar8 < 0x19) {
          *it._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = it._stack._stack;
        }
        else if (uVar8 < 0x21) {
          *it._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = it._stack._stack;
        }
        else if (uVar8 < 0x31) {
          *it._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = it._stack._stack;
        }
        else if (uVar8 < 0x41) {
          *it._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = it._stack._stack;
        }
        else {
          operator_delete(it._stack._stack,0x10);
        }
      }
      if (iVar4 != 0) goto LAB_004dec4b;
      local_d8 = local_d8 + 1;
    } while (local_d8 != local_e8);
    iVar4 = 2;
LAB_004dec4b:
    bVar3 = iVar4 != 2;
  }
  return bVar3;
}

Assistant:

bool FunctionDefinitionDemodulation::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  Ordering& ordering = _salg->getOrdering();

  static DHSet<Term*> attempted;
  attempted.reset();

  unsigned cLen = cl->length();
  for (unsigned li = 0; li < cLen; li++) {
    Literal* lit = (*cl)[li];
    NonVariableNonTypeIterator it(lit);
    while (it.hasNext()) {
      TypedTermList trm = it.next();
      if (!attempted.insert(trm.term())) {
        it.right();
        continue;
      }

      bool redundancyCheck = _helper.redundancyCheckNeededForPremise(cl, lit, trm);

      auto git = _salg->getFunctionDefinitionHandler().getGeneralizations(trm);
      while (git.hasNext()) {
        auto qr = git.next();
        if (qr.data->clause->length() != 1) {
          continue;
        }
        auto rhs = EqHelper::getOtherEqualitySide(qr.data->literal, qr.data->term);
        // TODO shouldn't allow demodulation with incomparables in the non-ground case
        if (Ordering::isGreaterOrEqual(ordering.compare(rhs,qr.data->term))) {
          continue;
        }
        bool isEqTautology = false;
        auto res = performRewriting(
          cl, lit, trm, qr.data->clause, qr.data->literal, qr.data->term, qr.unifier, redundancyCheck ? &_helper : nullptr,
          isEqTautology, Inference(SimplifyingInference2(InferenceRule::FUNCTION_DEFINITION_DEMODULATION, cl, qr.data->clause)));
        if (!res && !isEqTautology) {
          continue;
        }
        if (!isEqTautology) {
          replacement = res;
        }
        premises = pvi(getSingletonIterator(qr.data->clause));
        return true;
      }
    }
  }

  return false;
}